

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O1

filepos_t __thiscall
libmatroska::KaxInternalBlock::UpdateSize(KaxInternalBlock *this,bool param_1,bool param_2)

{
  uint uVar1;
  uint uVar2;
  pointer ppDVar3;
  DataBuffer *pDVar4;
  LacingType LVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  ulong uVar8;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long lVar9;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  
  if ((this->super_EbmlBinary).Data != (binary *)0x0) {
    __assert_fail("EbmlBinary::GetBuffer() == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0xa9,"virtual filepos_t libmatroska::KaxInternalBlock::UpdateSize(bool, bool)");
  }
  if (0x3fff < this->TrackNumber) {
    __assert_fail("TrackNumber < 0x4000",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0xaa,"virtual filepos_t libmatroska::KaxInternalBlock::UpdateSize(bool, bool)");
  }
  ppDVar3 = (this->myBuffers).
            super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->myBuffers).
                super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar3 >> 3;
  if (lVar9 == 1) {
    pDVar4 = *ppDVar3;
    iVar7 = (*pDVar4->_vptr_DataBuffer[3])
                      (pDVar4,CONCAT71(in_register_00000031,param_1),
                       CONCAT71(in_register_00000011,param_2));
    uVar8 = (ulong)(*(int *)CONCAT44(extraout_var,iVar7) + 4);
  }
  else {
    if (lVar9 == 0) {
      (this->super_EbmlBinary).super_EbmlElement.Size = 0;
      goto LAB_0018a52f;
    }
    (this->super_EbmlBinary).super_EbmlElement.Size = 5;
    LVar5 = this->mLacing;
    if (LVar5 == LACING_AUTO) {
      LVar5 = GetBestLacingType(this);
    }
    if (LVar5 == LACING_XIPH) {
      if ((long)(this->myBuffers).
                super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->myBuffers).
                super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start == 8) {
LAB_0018a4a2:
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        do {
          iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
          iVar6 = (*(this->myBuffers).
                    super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8]->_vptr_DataBuffer[3])();
          uVar1 = *(uint *)CONCAT44(extraout_var_10,iVar6);
          iVar6 = (*(this->myBuffers).
                    super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8]->_vptr_DataBuffer[3])();
          (this->super_EbmlBinary).super_EbmlElement.Size =
               (ulong)*(uint *)CONCAT44(extraout_var_11,iVar6) / 0xff +
               (ulong)uVar1 + CONCAT44(extraout_var_09,iVar7) + 1;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (uVar8 < ((long)(this->myBuffers).
                                super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->myBuffers).
                                super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U);
      }
    }
    else if (LVar5 == LACING_EBML) {
      iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      iVar6 = (*(*(this->myBuffers).
                  super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_DataBuffer[3])();
      uVar1 = *(uint *)CONCAT44(extraout_var_03,iVar6);
      iVar6 = (*(*(this->myBuffers).
                  super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_DataBuffer[3])();
      iVar6 = libebml::CodedSizeLength
                        ((ulong)*(uint *)CONCAT44(extraout_var_04,iVar6),0,
                         (this->super_EbmlBinary).super_EbmlElement.bSizeIsFinite);
      (this->super_EbmlBinary).super_EbmlElement.Size =
           (long)iVar6 + (ulong)uVar1 + CONCAT44(extraout_var_02,iVar7);
      uVar8 = 1;
      if (((long)(this->myBuffers).
                 super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->myBuffers).
                 super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 3U < 0xfffffffffffffffe) {
        uVar8 = 1;
        do {
          iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
          iVar6 = (*(this->myBuffers).
                    super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8]->_vptr_DataBuffer[3])();
          uVar1 = *(uint *)CONCAT44(extraout_var_06,iVar6);
          iVar6 = (*(this->myBuffers).
                    super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8]->_vptr_DataBuffer[3])();
          uVar2 = *(uint *)CONCAT44(extraout_var_07,iVar6);
          iVar6 = (*(this->myBuffers).
                    super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar8 - 1]->_vptr_DataBuffer[3])
                            ();
          iVar6 = libebml::CodedSizeLengthSigned
                            ((ulong)uVar2 - (ulong)*(uint *)CONCAT44(extraout_var_08,iVar6),0);
          (this->super_EbmlBinary).super_EbmlElement.Size =
               (long)iVar6 + (ulong)uVar1 + CONCAT44(extraout_var_05,iVar7);
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (uVar8 < ((long)(this->myBuffers).
                                super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->myBuffers).
                                super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U);
      }
    }
    else {
      if (LVar5 != LACING_FIXED) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                      ,0xce,
                      "virtual filepos_t libmatroska::KaxInternalBlock::UpdateSize(bool, bool)");
      }
      if ((long)(this->myBuffers).
                super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->myBuffers).
                super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start == 8) goto LAB_0018a4a2;
      uVar8 = 0;
      do {
        iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
        iVar6 = (*(this->myBuffers).
                  super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8]->_vptr_DataBuffer[3])();
        (this->super_EbmlBinary).super_EbmlElement.Size =
             (ulong)*(uint *)CONCAT44(extraout_var_01,iVar6) + CONCAT44(extraout_var_00,iVar7);
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (uVar8 < ((long)(this->myBuffers).
                              super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->myBuffers).
                              super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U);
    }
    iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    iVar6 = (*(this->myBuffers).
              super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar8]->_vptr_DataBuffer[3])();
    uVar8 = (ulong)*(uint *)CONCAT44(extraout_var_13,iVar6) + CONCAT44(extraout_var_12,iVar7);
  }
  (this->super_EbmlBinary).super_EbmlElement.Size = uVar8;
LAB_0018a52f:
  if (0x7f < this->TrackNumber) {
    iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    (this->super_EbmlBinary).super_EbmlElement.Size = CONCAT44(extraout_var_14,iVar7) + 1;
  }
  iVar7 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_15,iVar7);
}

Assistant:

filepos_t KaxInternalBlock::UpdateSize(bool /* bSaveDefault */, bool /* bForceRender */)
{
  LacingType LacingHere;
  assert(EbmlBinary::GetBuffer() == NULL); // Data is not used for KaxInternalBlock
  assert(TrackNumber < 0x4000); // no more allowed for the moment
  unsigned int i;

  // compute the final size of the data
  switch (myBuffers.size()) {
    case 0:
      SetSize_(0);
      break;
    case 1:
      SetSize_(4 + myBuffers[0]->Size());
      break;
    default:
      SetSize_(4 + 1); // 1 for the lacing head
      if (mLacing == LACING_AUTO)
        LacingHere = GetBestLacingType();
      else
        LacingHere = mLacing;
      switch (LacingHere) {
        case LACING_XIPH:
          for (i=0; i<myBuffers.size()-1; i++) {
            SetSize_(GetSize() + myBuffers[i]->Size() + (myBuffers[i]->Size() / 0xFF + 1));
          }
          break;
        case LACING_EBML:
          SetSize_(GetSize() + myBuffers[0]->Size() + CodedSizeLength(myBuffers[0]->Size(), 0, IsFiniteSize()));
          for (i=1; i<myBuffers.size()-1; i++) {
            SetSize_(GetSize() + myBuffers[i]->Size() + CodedSizeLengthSigned(int64(myBuffers[i]->Size()) - int64(myBuffers[i-1]->Size()), 0));
          }
          break;
        case LACING_FIXED:
          for (i=0; i<myBuffers.size()-1; i++) {
            SetSize_(GetSize() + myBuffers[i]->Size());
          }
          break;
        default:
          i = 0;
          assert(0);
      }
      // Size of the last frame (not in lace)
      SetSize_(GetSize() + myBuffers[i]->Size());
      break;
  }

  if (TrackNumber >= 0x80)
    SetSize_(GetSize() + 1); // the size will be coded with one more octet

  return GetSize();
}